

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_c.h
# Opt level: O0

int MPIABI_Iscatterv(void *sendbuf,int *sendcounts,int *displs,MPIABI_Datatype sendtype,
                    void *recvbuf,int recvcount,MPIABI_Datatype recvtype,int root,MPIABI_Comm comm,
                    MPIABI_Request *request)

{
  void *pvVar1;
  int iVar2;
  ompi_datatype_t *poVar3;
  ompi_datatype_t *poVar4;
  ompi_communicator_t *poVar5;
  ompi_request_t **ppoVar6;
  WPI_HandlePtr<ompi_request_t_*> local_68;
  WPI_Handle local_60 [8];
  WPI_Handle local_58 [8];
  WPI_Handle local_50 [12];
  int local_44;
  void *pvStack_40;
  int recvcount_local;
  void *recvbuf_local;
  MPIABI_Datatype sendtype_local;
  int *displs_local;
  int *sendcounts_local;
  void *sendbuf_local;
  
  local_44 = recvcount;
  pvStack_40 = recvbuf;
  recvbuf_local = (void *)sendtype;
  sendtype_local = (MPIABI_Datatype)displs;
  displs_local = sendcounts;
  sendcounts_local = (int *)sendbuf;
  WPI_Handle<ompi_datatype_t_*>::WPI_Handle((WPI_Handle<ompi_datatype_t_*> *)local_50,sendtype);
  poVar3 = WPI_Handle::operator_cast_to_ompi_datatype_t_(local_50);
  pvVar1 = pvStack_40;
  iVar2 = local_44;
  WPI_Handle<ompi_datatype_t_*>::WPI_Handle((WPI_Handle<ompi_datatype_t_*> *)local_58,recvtype);
  poVar4 = WPI_Handle::operator_cast_to_ompi_datatype_t_(local_58);
  WPI_Handle<ompi_communicator_t_*>::WPI_Handle((WPI_Handle<ompi_communicator_t_*> *)local_60,comm);
  poVar5 = WPI_Handle::operator_cast_to_ompi_communicator_t_(local_60);
  WPI_HandlePtr<ompi_request_t_*>::WPI_HandlePtr(&local_68,request);
  ppoVar6 = WPI_HandlePtr::operator_cast_to_ompi_request_t__((WPI_HandlePtr *)&local_68);
  iVar2 = MPI_Iscatterv(sendbuf,sendcounts,displs,poVar3,pvVar1,iVar2,poVar4,root,poVar5,ppoVar6);
  WPI_HandlePtr<ompi_request_t_*>::~WPI_HandlePtr(&local_68);
  return iVar2;
}

Assistant:

int MPIABI_Iscatterv(
  const void * sendbuf,
  const int * sendcounts,
  const int * displs,
  MPIABI_Datatype sendtype,
  void * recvbuf,
  int recvcount,
  MPIABI_Datatype recvtype,
  int root,
  MPIABI_Comm comm,
  MPIABI_Request * request
) {
  return MPI_Iscatterv(
    sendbuf,
    sendcounts,
    displs,
    (MPI_Datatype)(WPI_Datatype)sendtype,
    recvbuf,
    recvcount,
    (MPI_Datatype)(WPI_Datatype)recvtype,
    root,
    (MPI_Comm)(WPI_Comm)comm,
    (MPI_Request *)(WPI_RequestPtr)request
  );
}